

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,APIName *name)

{
  APIName *name_local;
  string *s;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  switch(*(undefined4 *)this) {
  case 0:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"MaterialBindingAPI");
    break;
  case 1:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"ConnectableAPI");
    break;
  case 2:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"CoordSysAPI");
    break;
  case 3:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"NodeDefAPI");
    break;
  case 4:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"CollectionAPI");
    break;
  case 5:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"GeomModelAPI");
    break;
  case 6:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"MotionAPI");
    break;
  case 7:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"PrimvarsAPI");
    break;
  case 8:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"VisibilityAPI");
    break;
  case 9:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"XformCommonAPI");
    break;
  case 10:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"LightAPI");
    break;
  case 0xb:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"LightListAPI");
    break;
  case 0xc:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"ListAPI");
    break;
  case 0xd:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"MeshLightAPI");
    break;
  case 0xe:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"ShapingAPI");
    break;
  case 0xf:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"ShadowAPI");
    break;
  case 0x10:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"VolumeLightAPI");
    break;
  case 0x11:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"SkelBindingAPI");
    break;
  case 0x12:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"Preliminary_AnchoringAPI");
    break;
  case 0x13:
    ::std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"Preliminary_PhysicsColliderAPI");
    break;
  case 0x14:
    ::std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"Preliminary_PhysicsMaterialAPI");
    break;
  case 0x15:
    ::std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"Preliminary_PhysicsRigidBodyAPI");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const APISchemas::APIName &name) {
  std::string s;

  switch (name) {
    case APISchemas::APIName::VisibilityAPI: {
      s = "VisibilityAPI";
      break;
    }
    case APISchemas::APIName::XformCommonAPI: {
      s = "XformCommonAPI";
      break;
    }
    case APISchemas::APIName::SkelBindingAPI: {
      s = "SkelBindingAPI";
      break;
    }
    case APISchemas::APIName::MotionAPI: {
      s = "MotionAPI";
      break;
    }
    case APISchemas::APIName::PrimvarsAPI: {
      s = "PrimvarsAPI";
      break;
    }
    case APISchemas::APIName::CollectionAPI: {
      s = "CollectionAPI";
      break;
    }
    case APISchemas::APIName::ConnectableAPI: {
      s = "ConnectableAPI";
      break;
    }
    case APISchemas::APIName::CoordSysAPI: {
      s = "CoordSysAPI";
      break;
    }
    case APISchemas::APIName::NodeDefAPI: {
      s = "NodeDefAPI";
      break;
    }
    case APISchemas::APIName::MaterialBindingAPI: {
      s = "MaterialBindingAPI";
      break;
    }
    case APISchemas::APIName::ShapingAPI: {
      s = "ShapingAPI";
      break;
    }
    case APISchemas::APIName::ShadowAPI: {
      s = "ShadowAPI";
      break;
    }
    case APISchemas::APIName::GeomModelAPI: {
      s = "GeomModelAPI";
      break;
    }
    case APISchemas::APIName::ListAPI: {
      s = "ListAPI";
      break;
    }
    case APISchemas::APIName::LightAPI: {
      s = "LightAPI";
      break;
    }
    case APISchemas::APIName::LightListAPI: {
      s = "LightListAPI";
      break;
    }
    case APISchemas::APIName::VolumeLightAPI: {
      s = "VolumeLightAPI";
      break;
    }
    case APISchemas::APIName::MeshLightAPI: {
      s = "MeshLightAPI";
      break;
    }
    case APISchemas::APIName::Preliminary_AnchoringAPI: {
      s = "Preliminary_AnchoringAPI";
      break;
    }
    case APISchemas::APIName::Preliminary_PhysicsColliderAPI: {
      s = "Preliminary_PhysicsColliderAPI";
      break;
    }
    case APISchemas::APIName::Preliminary_PhysicsRigidBodyAPI: {
      s = "Preliminary_PhysicsRigidBodyAPI";
      break;
    }
    case APISchemas::APIName::Preliminary_PhysicsMaterialAPI: {
      s = "Preliminary_PhysicsMaterialAPI";
      break;
    }
  }

  return s;
}